

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManFromIfAig_rec(Gia_Man_t *pNew,If_Man_t *pIfMan,If_Obj_t *pIfObj)

{
  int iVar1;
  int iVar2;
  
  if ((pIfObj->field_22).iCopy != 0) {
    return (pIfObj->field_22).iCopy;
  }
  iVar1 = Gia_ManFromIfAig_rec(pNew,pIfMan,pIfObj->pFanin0);
  iVar2 = Gia_ManFromIfAig_rec(pNew,pIfMan,pIfObj->pFanin1);
  iVar1 = Abc_LitNotCond(iVar1,*(uint *)pIfObj >> 4 & 1);
  iVar2 = Abc_LitNotCond(iVar2,*(uint *)pIfObj >> 5 & 1);
  iVar1 = Gia_ManHashAnd(pNew,iVar1,iVar2);
  (pIfObj->field_22).iCopy = iVar1;
  return iVar1;
}

Assistant:

int Gia_ManFromIfAig_rec( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Obj_t * pIfObj )
{
    int iLit0, iLit1;
    if ( pIfObj->iCopy )
        return pIfObj->iCopy;
    iLit0 = Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj->pFanin0 );
    iLit1 = Gia_ManFromIfAig_rec( pNew, pIfMan, pIfObj->pFanin1 );
    iLit0 = Abc_LitNotCond( iLit0, pIfObj->fCompl0 );
    iLit1 = Abc_LitNotCond( iLit1, pIfObj->fCompl1 );
    pIfObj->iCopy = Gia_ManHashAnd( pNew, iLit0, iLit1 );
    return pIfObj->iCopy;
}